

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_over_ip.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cache_over_ip::cache_over_ip
          (cache_over_ip *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ips,vector<int,_std::allocator<int>_> *ports,intrusive_ptr<cppcms::impl::base_cache> *l1)

{
  vector<int,_std::allocator<int>_> *in_RCX;
  base_cache *in_RDI;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  
  base_cache::base_cache(in_RDI);
  in_RDI->_vptr_base_cache = (_func_int **)&PTR_fetch_00530108;
  booster::thread_specific_ptr<cppcms::impl::tcp_cache>::thread_specific_ptr
            ((thread_specific_ptr<cppcms::impl::tcp_cache> *)0x47ec07);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RCX,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::vector(in_RCX,in_stack_ffffffffffffffd8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 8),in_stack_ffffffffffffff88);
  booster::atomic_counter::atomic_counter((atomic_counter *)(in_RDI + 9),0);
  return;
}

Assistant:

cache_over_ip(std::vector<std::string> ips,std::vector<int> ports,booster::intrusive_ptr<base_cache> l1) :
			ips_(ips),
			ports_(ports),
			l1_(l1),
			refs_(0)
		{
		}